

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

int CVmBifTIO::map_raw_key(char *namebuf,char *c,size_t len)

{
  char cVar1;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t outlen;
  undefined8 local_28 [2];
  char *local_18;
  char *local_10 [2];
  
  local_10[0] = in_RDI;
  if ((in_RDX != 1) || (((*in_RSI < '\x01' || ('\x1b' < *in_RSI)) && (*in_RSI != '\x7f')))) {
    local_28[0] = 0x20;
    (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[4])
              (G_cmap_from_ui_X,local_10,local_28,in_RSI,in_RDX);
    *local_10[0] = '\0';
    return 1;
  }
  cVar1 = *in_RSI;
  if (cVar1 != '\b') {
    if (cVar1 == '\t') {
      *in_RDI = '\t';
      in_RDI[1] = '\0';
      return 1;
    }
    if ((cVar1 == '\n') || (cVar1 == '\r')) {
      *in_RDI = '\n';
      in_RDI[1] = '\0';
      return 1;
    }
    if (cVar1 == '\x1b') {
      strcpy(in_RDI,"[esc]");
      return 1;
    }
    if (cVar1 != '\x7f') {
      local_18 = in_RSI;
      strcpy(in_RDI,"[ctrl-?]");
      local_10[0][6] = *local_18 + '`';
      return 1;
    }
  }
  strcpy(in_RDI,"[bksp]");
  return 1;
}

Assistant:

int CVmBifTIO::map_raw_key(VMG_ char *namebuf, const char *c, size_t len)
{
    size_t outlen;

    /* if it's a control character, give it a portable key name */
    if (len == 1 && ((c[0] >= 1 && c[0] <= 27) || c[0] == 127))
    {
        switch(c[0])
        {
        case 10:
        case 13:
            /* 
             *   return an ASCII 10 (regardless of local newline conventions
             *   - this is the internal string representation, which we
             *   define to use ASCII 10 to represent a newline everywhere) 
             */
            namebuf[0] = 10;
            namebuf[1] = '\0';
            return TRUE;

        case 9:
            /* return ASCII 9 for TAB characters */
            namebuf[0] = 9;
            namebuf[1] = '\0';
            return TRUE;

        case 8:
        case 127:
            /* return '[bksp]' for backspace/del characters */
            strcpy(namebuf, "[bksp]");
            return TRUE;

        case 27:
            /* return '[esc]' for the escape key */
            strcpy(namebuf, "[esc]");
            return TRUE;

        default:
            /* return '[ctrl-X]' for other control characters */
            strcpy(namebuf, "[ctrl-?]");
            namebuf[6] = (char)(c[0] + 'a' - 1);
            return TRUE;
        }
    }

    /* map the character to wide Unicode */
    outlen = 32;
    G_cmap_from_ui->map(&namebuf, &outlen, c, len);

    /* null-terminate the result */
    *namebuf = '\0';

    /* successfully mapped */
    return TRUE;
}